

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintInt64
          (FastFieldValuePrinter *this,int64_t val,BaseTextGenerator *generator)

{
  Nonnull<char_*> pcVar1;
  long *local_70;
  undefined8 local_68;
  long local_60 [2];
  long local_50;
  Nonnull<char_*> local_48;
  char local_40 [32];
  
  pcVar1 = absl::lts_20250127::numbers_internal::FastIntToBuffer(val,local_40);
  local_50 = (long)pcVar1 - (long)local_40;
  local_70 = local_60;
  local_48 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,local_40,pcVar1);
  (*generator->_vptr_BaseTextGenerator[5])(generator,local_70,local_68);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintInt64(
    int64_t val, BaseTextGenerator* generator) const {
  generator->PrintString(absl::StrCat(val));
}